

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall
cmCTestTestHandler::LogTestSummary
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *passed,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *failed,cmDuration *durationInSecs)

{
  pointer pbVar1;
  pointer pbVar2;
  cmCTest *pcVar3;
  bool bVar4;
  ostream *poVar5;
  size_t sVar6;
  ulong uVar7;
  string *this_00;
  float fVar8;
  string failedColorCode;
  string passColorCode;
  ostringstream cmCTestLog_msg_1;
  char realBuf [1024];
  float local_614;
  string local_610;
  char *local_5f0;
  long local_5e8;
  char local_5e0;
  undefined7 uStack_5df;
  char *local_5d0;
  long local_5c8;
  char local_5c0;
  undefined7 uStack_5bf;
  undefined1 local_5b0 [112];
  ios_base local_540 [264];
  string local_438 [3];
  ios_base local_3c8 [920];
  
  uVar7 = (long)(passed->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(passed->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  pbVar1 = (failed->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (failed->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  fVar8 = ((float)uVar7 * 100.0) / (float)(((long)pbVar1 - (long)pbVar2 >> 5) + uVar7);
  local_614 = fVar8;
  if ((pbVar1 != pbVar2) && (local_614 = 99.0, fVar8 <= 99.0)) {
    local_614 = fVar8;
  }
  local_5c8 = 0;
  local_5c0 = '\0';
  local_5f0 = &local_5e0;
  local_5e8 = 0;
  local_5e0 = '\0';
  local_5d0 = &local_5c0;
  if (pbVar1 == pbVar2) {
    cmCTest::GetColorCode_abi_cxx11_(local_438,(this->super_cmCTestGenericHandler).CTest,GREEN);
    this_00 = (string *)&local_5d0;
  }
  else {
    cmCTest::GetColorCode_abi_cxx11_(local_438,(this->super_cmCTestGenericHandler).CTest,RED);
    this_00 = (string *)&local_5f0;
  }
  std::__cxx11::string::operator=(this_00,(string *)local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
    operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::ios::widen((char)local_438 + (char)*(undefined8 *)(local_438[0]._M_dataplus._M_p + -0x18));
  std::ostream::put((char)local_438);
  poVar5 = (ostream *)std::ostream::flush();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_5d0,local_5c8);
  lroundf(local_614);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"% tests passed",0xe);
  cmCTest::GetColorCode_abi_cxx11_
            ((string *)local_5b0,(this->super_cmCTestGenericHandler).CTest,CLEAR_COLOR);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_5b0._0_8_,local_5b0._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_5f0,local_5e8);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," tests failed",0xd);
  cmCTest::GetColorCode_abi_cxx11_(&local_610,(this->super_cmCTestGenericHandler).CTest,CLEAR_COLOR)
  ;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_610._M_dataplus._M_p,local_610._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," out of ",8);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
    operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
  }
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x264,(char *)local_5b0._0_8_,false);
  if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
    operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  cmCTest::GetLabelsForSubprojects_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_438,(this->super_cmCTestGenericHandler).CTest);
  if (local_438[0]._M_dataplus._M_p == (pointer)local_438[0]._M_string_length) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_438);
  }
  else {
    bVar4 = cmCTest::GetSubprojectSummary((this->super_cmCTestGenericHandler).CTest);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_438);
    if (bVar4) {
      PrintLabelOrSubprojectSummary(this,true);
    }
  }
  bVar4 = cmCTest::GetLabelSummary((this->super_cmCTestGenericHandler).CTest);
  if (bVar4) {
    PrintLabelOrSubprojectSummary(this,false);
  }
  snprintf((char *)local_438,0x400,"%6.2f sec",durationInSecs->__r);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5b0,"\nTotal Test time (real) = ",0x1a);
  sVar6 = strlen((char *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,(char *)local_438,sVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"\n",1);
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x270,local_610._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  if (local_5f0 != &local_5e0) {
    operator_delete(local_5f0,CONCAT71(uStack_5df,local_5e0) + 1);
  }
  if (local_5d0 != &local_5c0) {
    operator_delete(local_5d0,CONCAT71(uStack_5bf,local_5c0) + 1);
  }
  return;
}

Assistant:

void cmCTestTestHandler::LogTestSummary(const std::vector<std::string>& passed,
                                        const std::vector<std::string>& failed,
                                        const cmDuration& durationInSecs)
{
  std::size_t total = passed.size() + failed.size();

  float percent =
    static_cast<float>(passed.size()) * 100.0f / static_cast<float>(total);
  if (!failed.empty() && percent > 99) {
    percent = 99;
  }

  std::string passColorCode;
  std::string failedColorCode;
  if (failed.empty()) {
    passColorCode = this->CTest->GetColorCode(cmCTest::Color::GREEN);
  } else {
    failedColorCode = this->CTest->GetColorCode(cmCTest::Color::RED);
  }
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             std::endl
               << passColorCode << std::lround(percent) << "% tests passed"
               << this->CTest->GetColorCode(cmCTest::Color::CLEAR_COLOR)
               << ", " << failedColorCode << failed.size() << " tests failed"
               << this->CTest->GetColorCode(cmCTest::Color::CLEAR_COLOR)
               << " out of " << total << std::endl);
  if ((!this->CTest->GetLabelsForSubprojects().empty() &&
       this->CTest->GetSubprojectSummary())) {
    this->PrintLabelOrSubprojectSummary(true);
  }
  if (this->CTest->GetLabelSummary()) {
    this->PrintLabelOrSubprojectSummary(false);
  }
  char realBuf[1024];
  snprintf(realBuf, sizeof(realBuf), "%6.2f sec", durationInSecs.count());
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "\nTotal Test time (real) = " << realBuf << "\n",
                     this->Quiet);
}